

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Any.hpp
# Opt level: O2

Any __thiscall rc::detail::Any::of<unsigned_long>(Any *this,unsigned_long *value)

{
  _Head_base<0UL,_rc::detail::Any::IAnyImpl_*,_false> _Var1;
  _Head_base<0UL,_rc::detail::Any::IAnyImpl_*,_false> _Var2;
  
  Any(this);
  _Var2._M_head_impl = (IAnyImpl *)operator_new(0x10);
  (_Var2._M_head_impl)->_vptr_IAnyImpl = (_func_int **)&PTR_get_001a6f80;
  _Var2._M_head_impl[1]._vptr_IAnyImpl = (_func_int **)*value;
  _Var1._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<rc::detail::Any::IAnyImpl,_std::default_delete<rc::detail::Any::IAnyImpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_rc::detail::Any::IAnyImpl_*,_std::default_delete<rc::detail::Any::IAnyImpl>_>
       .super__Head_base<0UL,_rc::detail::Any::IAnyImpl_*,_false>._M_head_impl;
  (this->m_impl)._M_t.
  super___uniq_ptr_impl<rc::detail::Any::IAnyImpl,_std::default_delete<rc::detail::Any::IAnyImpl>_>.
  _M_t.
  super__Tuple_impl<0UL,_rc::detail::Any::IAnyImpl_*,_std::default_delete<rc::detail::Any::IAnyImpl>_>
  .super__Head_base<0UL,_rc::detail::Any::IAnyImpl_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (IAnyImpl *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_IAnyImpl[5])();
  }
  return (unique_ptr<rc::detail::Any::IAnyImpl,_std::default_delete<rc::detail::Any::IAnyImpl>_>)
         (unique_ptr<rc::detail::Any::IAnyImpl,_std::default_delete<rc::detail::Any::IAnyImpl>_>)
         this;
}

Assistant:

Any Any::of(T &&value) {
  Any any;
  any.m_impl.reset(new AnyImpl<Decay<T>>(std::forward<T>(value)));
  return any;
}